

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Scanner::visitExpression(wasm::Expression__
          (void *this,Expression *curr)

{
  bool bVar1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *this_00;
  Type type_00;
  pointer pTVar2;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_58;
  Expression *local_40;
  Expression *curr_local;
  Type type;
  
  local_40 = curr;
  bVar1 = canBeArbitrarilyReplaced(*(TranslateToFuzzReader **)((long)this + 0xd8),curr);
  if (bVar1) {
    getRelevantTypes(wasm::Type_
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_58,(void *)(curr->type).id,
               type_00);
    for (pTVar2 = local_58._M_impl.super__Vector_impl_data._M_start;
        pTVar2 != local_58._M_impl.super__Vector_impl_data._M_finish; pTVar2 = pTVar2 + 1) {
      curr_local = (Expression *)pTVar2->id;
      this_00 = InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                ::operator[]((InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                              *)((long)this + 0xe0),(Type *)&curr_local);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (this_00,&local_40);
    }
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_58);
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      if (parent.canBeArbitrarilyReplaced(curr)) {
        for (auto type : getRelevantTypes(curr->type)) {
          exprsByType[type].push_back(curr);
        }
      }
    }